

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::ServiceDescriptorProto::IsInitialized(ServiceDescriptorProto *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ServiceOptions *pSVar5;
  long lVar6;
  
  iVar3 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
  bVar2 = 0 < iVar3;
  if (iVar3 < 1) {
LAB_001edf87:
    if ((this->_has_bits_[0] & 4) != 0) {
      pSVar5 = this->options_;
      if (pSVar5 == (ServiceOptions *)0x0) {
        pSVar5 = *(ServiceOptions **)(default_instance_ + 0x30);
      }
      iVar3 = (*(pSVar5->super_Message).super_MessageLite._vptr_MessageLite[5])();
      if ((char)iVar3 == '\0') goto LAB_001edfaf;
    }
    bVar2 = true;
  }
  else {
    cVar1 = (**(code **)(**(this->method_).super_RepeatedPtrFieldBase.elements_ + 0x28))();
    if (cVar1 != '\0') {
      lVar6 = 1;
      do {
        lVar4 = (long)(this->method_).super_RepeatedPtrFieldBase.current_size_;
        bVar2 = lVar6 < lVar4;
        if (lVar4 <= lVar6) goto LAB_001edf87;
        cVar1 = (**(code **)(*(this->method_).super_RepeatedPtrFieldBase.elements_[lVar6] + 0x28))()
        ;
        lVar6 = lVar6 + 1;
      } while (cVar1 != '\0');
    }
    if (!bVar2) goto LAB_001edf87;
LAB_001edfaf:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ServiceDescriptorProto::IsInitialized() const {

  for (int i = 0; i < method_size(); i++) {
    if (!this->method(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}